

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::CreateContext::CreateContext
          (CreateContext *this,EGLDisplay display,EGLConfig config,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *shared,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  GLES2Context *pGVar3;
  GLES2Context *pGVar4;
  GLES2ResourceManager *pGVar5;
  SharedPtrStateBase *pSVar6;
  deInt32 *pdVar7;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> local_78;
  undefined4 local_5c;
  SharedPtr<tcu::ThreadUtil::Event> local_58;
  SharedPtr<tcu::ThreadUtil::Object> local_48;
  GLES2Context *local_38;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"CreateContext");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CreateContext_003eaa90;
  this->m_display = display;
  this->m_config = config;
  (this->m_shared).m_ptr = shared->m_ptr;
  pSVar2 = shared->m_state;
  (this->m_shared).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_shared).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_context).m_ptr = (GLES2Context *)0x0;
  (this->m_context).m_state = (SharedPtrStateBase *)0x0;
  pGVar4 = shared->m_ptr;
  if (pGVar4 != (GLES2Context *)0x0) {
    local_48.m_state = shared->m_state;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_48.m_ptr = &pGVar4->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_48);
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_48.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_48.m_ptr = (Object *)0x0;
        (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_48.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (local_48.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_48.m_state = (SharedPtrStateBase *)0x0;
      }
    }
  }
  pGVar4 = (GLES2Context *)operator_new(0x60);
  local_58.m_ptr = (this->super_Operation).m_event.m_ptr;
  local_58.m_state = (this->super_Operation).m_event.m_state;
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  pGVar3 = shared->m_ptr;
  local_5c = (undefined4)
             CONCAT71((int7)((ulong)local_58.m_state >> 8),pGVar3 != (GLES2Context *)0x0);
  local_38 = pGVar4;
  if (pGVar3 == (GLES2Context *)0x0) {
    pGVar5 = (GLES2ResourceManager *)operator_new(0x60);
    (pGVar5->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pGVar5->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pGVar5->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pGVar5->m_programs).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pGVar5->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pGVar5->m_shaders).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pGVar5->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pGVar5->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pGVar5->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pGVar5->m_buffers).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pGVar5->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pGVar5->m_textures).
    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pGVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_003eb628;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pGVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
  }
  else {
    local_78.m_ptr = (pGVar3->resourceManager).m_ptr;
    local_78.m_state = (pGVar3->resourceManager).m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_78.m_state)->weakRefCount = (local_78.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  GLES2Context::GLES2Context(pGVar4,&local_58,&local_78);
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar6->strongRefCount;
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_003eb668;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)local_38;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  pSVar2 = context->m_state;
  if (pSVar2 != pSVar6) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar7 = &pSVar2->strongRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        context->m_ptr = (GLES2Context *)0x0;
        (*context->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar7 = &context->m_state->weakRefCount;
      *pdVar7 = *pdVar7 + -1;
      UNLOCK();
      if (*pdVar7 == 0) {
        if (context->m_state != (SharedPtrStateBase *)0x0) {
          (*context->m_state->_vptr_SharedPtrStateBase[1])();
        }
        context->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    context->m_ptr = local_38;
    context->m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar7 = &context->m_state->weakRefCount;
    *pdVar7 = *pdVar7 + 1;
    UNLOCK();
  }
  pdVar7 = &pSVar6->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
  }
  LOCK();
  *pdVar7 = *pdVar7 + -1;
  UNLOCK();
  if (*pdVar7 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (GLES2ResourceManager *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.m_ptr = (Event *)0x0;
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_58.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_58.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->m_context).m_state;
  if (pSVar2 != context->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_context).m_ptr = (GLES2Context *)0x0;
        (*((this->m_context).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_context).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_context).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_context).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_context).m_ptr = context->m_ptr;
    pSVar2 = context->m_state;
    (this->m_context).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_context).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

CreateContext::CreateContext (EGLDisplay display, EGLConfig config, SharedPtr<GLES2Context> shared, SharedPtr<GLES2Context>& context)
	: tcu::ThreadUtil::Operation	("CreateContext")
	, m_display					(display)
	, m_config					(config)
	, m_shared					(shared)
{
	if (shared)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(shared));

	context = SharedPtr<GLES2Context>(new GLES2Context(getEvent(), (shared ? shared->resourceManager : SharedPtr<GLES2ResourceManager>(new GLES2ResourceManager))));
	m_context = context;
}